

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManDumpVerilog(Gia_Man_t *p,char *pFileName,Vec_Int_t *vObjs)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  FILE *__s;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  size_t sVar3;
  ushort **ppuVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  uint local_5c;
  
  local_5c = p->nObjs;
  if (1 < local_5c) {
    uVar7 = local_5c - 1;
    if (uVar7 == 0) {
      local_5c = 0;
    }
    else {
      local_5c = 0;
      do {
        local_5c = local_5c + 1;
        bVar15 = 9 < uVar7;
        uVar7 = uVar7 / 10;
      } while (bVar15);
    }
  }
  uVar7 = p->vCis->nSize - p->nRegs;
  if (1 < uVar7) {
    uVar10 = 0;
    uVar13 = uVar7 - 1;
    uVar7 = uVar10;
    if (uVar13 != 0) {
      do {
        uVar7 = uVar10 + 1;
        bVar15 = 9 < uVar13;
        uVar13 = uVar13 / 10;
        uVar10 = uVar7;
      } while (bVar15);
    }
  }
  if (p->nRegs != 0) {
    puts("Currently cannot write sequential AIG.");
    return;
  }
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  p_00 = Gia_ManGenUsed(p,0);
  p_01 = Gia_ManGenUsed(p,1);
  fwrite("module ",7,1,__s);
  pcVar9 = p->pName;
  sVar3 = strlen(pcVar9);
  if (0 < (int)sVar3) {
    lVar12 = 0;
    ppuVar4 = __ctype_b_loc();
    do {
      iVar8 = (int)pcVar9[lVar12];
      if (((*ppuVar4)[iVar8] & 0xc00) == 0) {
        iVar8 = 0x5f;
      }
      fputc(iVar8,__s);
      lVar12 = lVar12 + 1;
      pcVar9 = p->pName;
      sVar3 = strlen(pcVar9);
    } while (lVar12 < (int)sVar3);
  }
  fwrite(" (\n    ",7,1,__s);
  Gia_ManWriteNames((FILE *)__s,'x',p->vCis->nSize - p->nRegs,p->vNamesIn,4,4,(Vec_Bit_t *)0x0);
  fwrite(",\n    ",6,1,__s);
  Gia_ManWriteNames((FILE *)__s,'z',p->vCos->nSize - p->nRegs,p->vNamesOut,4,4,(Vec_Bit_t *)0x0);
  fwrite("\n  );\n\n",7,1,__s);
  fwrite("  input ",8,1,__s);
  Gia_ManWriteNames((FILE *)__s,'x',p->vCis->nSize - p->nRegs,p->vNamesIn,8,4,(Vec_Bit_t *)0x0);
  fwrite(";\n\n",3,1,__s);
  fwrite("  output ",9,1,__s);
  Gia_ManWriteNames((FILE *)__s,'z',p->vCos->nSize - p->nRegs,p->vNamesOut,9,4,(Vec_Bit_t *)0x0);
  fwrite(";\n\n",3,1,__s);
  iVar8 = Vec_BitCount(p_01);
  if (iVar8 != 0) {
    fwrite("  wire ",7,1,__s);
    Gia_ManWriteNames((FILE *)__s,'n',p->nObjs,(Vec_Ptr_t *)0x0,7,4,p_01);
    fwrite(";\n\n",3,1,__s);
  }
  iVar8 = Vec_BitCount(p_00);
  if (iVar8 != 0) {
    fwrite("  wire ",7,1,__s);
    Gia_ManWriteNames((FILE *)__s,'i',p->nObjs,(Vec_Ptr_t *)0x0,7,4,p_00);
    fwrite(";\n\n",3,1,__s);
  }
  if (vObjs != (Vec_Int_t *)0x0) {
    fwrite("  wire ",7,1,__s);
    iVar8 = vObjs->nSize;
    if (0 < iVar8) {
      uVar14 = 0;
      do {
        pcVar9 = "";
        if ((int)uVar14 != iVar8 + -1) {
          pcVar9 = ",";
        }
        fprintf(__s," t_%d%s",uVar14,pcVar9);
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
        iVar8 = vObjs->nSize;
      } while ((int)uVar13 < iVar8);
    }
    fwrite(";\n\n",3,1,__s);
    if (0 < vObjs->nSize) {
      uVar14 = 0;
      do {
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)local_5c,
                (ulong)(uint)vObjs->pArray[uVar14],0x6e);
        fprintf(__s,"  buf( %s,",Gia_ObjGetDumpName::pBuffer);
        fprintf(__s," t_%d );\n",uVar14 & 0xffffffff);
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)vObjs->nSize);
    }
    fputc(10,__s);
  }
  pVVar5 = p->vCis;
  uVar14 = (ulong)(uint)pVVar5->nSize;
  if (p->nRegs < pVVar5->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar14 <= lVar12) goto LAB_0021c4bd;
      uVar13 = pVVar5->pArray[lVar12];
      if (((int)uVar13 < 0) || (p->nObjs <= (int)uVar13)) goto LAB_0021c460;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (p_01->nSize <= (int)uVar13) goto LAB_0021c47f;
      if (((uint)p_01->pArray[uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)local_5c,(ulong)uVar13,0x6e);
        fprintf(__s,"  buf( %s,",Gia_ObjGetDumpName::pBuffer);
        Gia_ObjGetDumpName(p->vNamesIn,'x',(int)lVar12,uVar7);
        fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
      }
      pGVar1 = pGVar1 + uVar13;
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) goto LAB_0021c49e;
      uVar14 = ((long)pGVar1 - (long)pGVar2 >> 2) * -0x5555555555555555;
      uVar13 = (uint)uVar14;
      if (((int)uVar13 < 0) || (p_00->nSize <= (int)uVar13)) goto LAB_0021c47f;
      if ((*(uint *)((long)p_00->pArray + (ulong)((uint)(uVar14 >> 3) & 0xffffffc)) >>
           (uVar13 & 0x1f) & 1) != 0) {
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x69,(ulong)local_5c,uVar14,0x69);
        fprintf(__s,"  not( %s,",Gia_ObjGetDumpName::pBuffer);
        Gia_ObjGetDumpName(p->vNamesIn,'x',(int)lVar12,uVar7);
        fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
      }
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCis;
      uVar14 = (ulong)pVVar5->nSize;
    } while (lVar12 < (long)(uVar14 - (long)p->nRegs));
  }
  fputc(10,__s);
  if (0 < p->nObjs) {
    uVar14 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + uVar14;
      if ((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) {
        uVar7 = (uint)uVar14;
        if (vObjs == (Vec_Int_t *)0x0) {
LAB_0021c07d:
          sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)local_5c,uVar14 & 0xffffffff,
                  0x6e);
          fprintf(__s,"  and( %s,",Gia_ObjGetDumpName::pBuffer);
          uVar13 = (uint)((*(uint *)pGVar1 >> 0x1d & 1) == 0) * 5 + 0x69;
          sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)uVar13,(ulong)local_5c,
                  (ulong)(uVar7 - (*(uint *)pGVar1 & 0x1fffffff)),(ulong)uVar13);
          fprintf(__s," %s,",Gia_ObjGetDumpName::pBuffer);
          uVar13 = (uint)((*(ulong *)pGVar1 >> 0x3d & 1) == 0) * 5 + 0x69;
          sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)uVar13,(ulong)local_5c,
                  (ulong)(uVar7 - ((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff)),(ulong)uVar13);
          fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
        }
        else {
          uVar6 = (ulong)vObjs->nSize;
          bVar15 = 0 < (long)uVar6;
          if ((long)uVar6 < 1) goto LAB_0021c07d;
          if (uVar14 != (uint)*vObjs->pArray) {
            uVar11 = 0;
            do {
              if (uVar6 - 1 == uVar11) goto LAB_0021c07d;
              lVar12 = uVar11 + 1;
              uVar11 = uVar11 + 1;
            } while (uVar14 != (uint)vObjs->pArray[lVar12]);
            bVar15 = uVar11 < uVar6;
          }
          if (!bVar15) goto LAB_0021c07d;
        }
        if ((long)p_00->nSize <= (long)uVar14) {
LAB_0021c47f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)p_00->pArray[uVar14 >> 5 & 0x7ffffff] >> (uVar7 & 0x1f) & 1) != 0) {
          sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x69,(ulong)local_5c,uVar14 & 0xffffffff,
                  0x69);
          fprintf(__s,"  not( %s,",Gia_ObjGetDumpName::pBuffer);
          sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)local_5c,uVar14 & 0xffffffff,
                  0x6e);
          fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)p->nObjs);
  }
  fputc(10,__s);
  uVar7 = p->vCos->nSize - p->nRegs;
  if (1 < uVar7) {
    uVar13 = 0;
    uVar10 = uVar7 - 1;
    uVar7 = uVar13;
    if (uVar10 != 0) {
      do {
        uVar7 = uVar13 + 1;
        bVar15 = 9 < uVar10;
        uVar13 = uVar7;
        uVar10 = uVar10 / 10;
      } while (bVar15);
    }
  }
  pVVar5 = p->vCos;
  uVar14 = (ulong)(uint)pVVar5->nSize;
  if (p->nRegs < pVVar5->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar14 <= lVar12) {
LAB_0021c4bd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = pVVar5->pArray[lVar12];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_0021c460:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar8;
      Gia_ObjGetDumpName(p->vNamesOut,'z',(int)lVar12,uVar7);
      fprintf(__s,"  buf( %s, ",Gia_ObjGetDumpName::pBuffer);
      uVar10 = (uint)*(ulong *)pGVar1;
      uVar13 = uVar10 & 0x1fffffff;
      if ((~*(ulong *)(pGVar1 + -(ulong)uVar13) & 0x1fffffff1fffffff) == 0) {
        fprintf(__s,"1\'b%d );\n",(ulong)((uint)(*(ulong *)pGVar1 >> 0x1d) & 1));
      }
      else {
        pGVar2 = p->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
LAB_0021c49e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar10 = (uint)((uVar10 >> 0x1d & 1) == 0) * 5 + 0x69;
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)uVar10,(ulong)local_5c,
                (ulong)((int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 - uVar13),
                (ulong)uVar10);
        fprintf(__s,"%s );\n",Gia_ObjGetDumpName::pBuffer);
      }
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCos;
      uVar14 = (ulong)pVVar5->nSize;
    } while (lVar12 < (long)(uVar14 - (long)p->nRegs));
  }
  fwrite("\nendmodule\n\n",0xc,1,__s);
  fclose(__s);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  if (p_00 != (Vec_Bit_t *)0x0) {
    free(p_00);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  if (p_01 == (Vec_Bit_t *)0x0) {
    return;
  }
  free(p_01);
  return;
}

Assistant:

void Gia_ManDumpVerilog( Gia_Man_t * p, char * pFileName, Vec_Int_t * vObjs )
{
    FILE * pFile;
    Gia_Obj_t * pObj;
    Vec_Bit_t * vInvs, * vUsed;
    int nDigits = Abc_Base10Log( Gia_ManObjNum(p) );
    int nDigits2 = Abc_Base10Log( Gia_ManPiNum(p) );
    int i, k, iObj;
    if ( Gia_ManRegNum(p) )
    {
        printf( "Currently cannot write sequential AIG.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }

    vInvs = Gia_ManGenUsed( p, 0 );
    vUsed = Gia_ManGenUsed( p, 1 );

    //fprintf( pFile, "// This Verilog file is written by ABC on %s\n\n", Extra_TimeStamp() );

    fprintf( pFile, "module " );
    for ( i = 0; i < (int)strlen(p->pName); i++ )
        if ( isalpha(p->pName[i]) || isdigit(p->pName[i]) )
            fprintf( pFile, "%c", p->pName[i] );
        else
            fprintf( pFile, "_" );
    fprintf( pFile, " (\n    " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 4, 4, NULL );
    fprintf( pFile, ",\n    " );

    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 4, 4, NULL );
    fprintf( pFile, "\n  );\n\n" );

    fprintf( pFile, "  input " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 8, 4, NULL );
    fprintf( pFile, ";\n\n" );

    fprintf( pFile, "  output " );
    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 9, 4, NULL );
    fprintf( pFile, ";\n\n" );

    if ( Vec_BitCount(vUsed) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'n', Gia_ManObjNum(p), NULL, 7, 4, vUsed );
        fprintf( pFile, ";\n\n" );
    }

    if ( Vec_BitCount(vInvs) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'i', Gia_ManObjNum(p), NULL, 7, 4, vInvs );
        fprintf( pFile, ";\n\n" );
    }

    if ( vObjs )
    {
        fprintf( pFile, "  wire " );
        Vec_IntForEachEntry( vObjs, iObj, i )
            fprintf( pFile, " t_%d%s", i, i==Vec_IntSize(vObjs)-1 ? "" : "," ); 
        fprintf( pFile, ";\n\n" );
        Vec_IntForEachEntry( vObjs, iObj, i )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', iObj, nDigits) );
            fprintf( pFile, " t_%d );\n", i );
        }
        fprintf( pFile, "\n" );
    }

    // input inverters
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Vec_BitEntry(vUsed, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
        if ( Vec_BitEntry(vInvs, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
    }

    // internal nodes and their inverters
    fprintf( pFile, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
    {
        int fSkip = 0;
        if ( vObjs )
        {
            Vec_IntForEachEntry( vObjs, iObj, k )
                if ( iObj == i )
                    break;
            if ( k < Vec_IntSize(vObjs) )
                fSkip = 1;
        }
        if ( !fSkip )
        {
            fprintf( pFile, "  and( %s,", Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
            fprintf( pFile, " %s,",       Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0(pObj, i), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC1(pObj)? 'i':'n'), Gia_ObjFaninId1(pObj, i), nDigits) );
        }
        if ( Vec_BitEntry(vInvs, i) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', i, nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
        }
    }
    
    // output drivers
    fprintf( pFile, "\n" );
    nDigits2 = Abc_Base10Log( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
/*
        fprintf( pFile, "  assign %s = ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d;\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s;\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
*/
        fprintf( pFile, "  buf( %s, ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d );\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s );\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
    }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );

    Vec_BitFree( vInvs );
    Vec_BitFree( vUsed );
}